

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

rf_image *
rf_load_pkm_image(rf_image *__return_storage_ptr__,void *src,rf_int src_size,rf_allocator allocator)

{
  rf_source_location rVar1;
  undefined1 auVar2 [24];
  rf_int dst_size;
  void *dst;
  uint uStack_54;
  rf_allocator local_38;
  
  local_38.user_data = allocator.user_data;
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  __return_storage_ptr__->format = 0;
  __return_storage_ptr__->valid = false;
  *(undefined3 *)&__return_storage_ptr__->field_0x15 = 0;
  if (0 < src_size && src != (void *)0x0) {
    local_38.allocator_proc = allocator.allocator_proc;
    dst_size = rf_get_pkm_image_size(src,src_size);
    rVar1.proc_name = "rf_load_pkm_image";
    rVar1.file_name =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    rVar1.line_in_file = 0x45db;
    auVar2._8_8_ = (ulong)uStack_54 << 0x20;
    auVar2._0_8_ = dst_size;
    auVar2._16_8_ = 0;
    dst = (*allocator.allocator_proc)
                    (&local_38,rVar1,RF_AM_ALLOC,(rf_allocator_args)(auVar2 << 0x40));
    rf_load_pkm_image_to_buffer(__return_storage_ptr__,src,src_size,dst,dst_size);
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_load_pkm_image(const void* src, rf_int src_size, rf_allocator allocator)
{
    rf_image result = {0};

    if (src && src_size > 0)
    {
        int dst_size = rf_get_pkm_image_size(src, src_size);
        void* dst = RF_ALLOC(allocator, dst_size);

        result = rf_load_pkm_image_to_buffer(src, src_size, dst, dst_size);
    }

    return result;
}